

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

BlockInfo * __thiscall
Wasm::WasmBytecodeGenerator::PushLabel
          (WasmBytecodeGenerator *this,WasmBlock blockData,ByteCodeLabel label,
          bool addBlockYieldInfo,bool checkInParams)

{
  IWasmByteCodeWriter *pIVar1;
  bool bVar2;
  OpCodeAsmJs OVar3;
  WasmType WVar4;
  Local expectedType;
  RegSlot RVar5;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *alloc;
  BlockInfo *this_00;
  PolymorphicEmitInfo *pPVar6;
  WasmSignature *this_01;
  WasmRegisterSpace *pWVar7;
  EmitInfo EVar8;
  EmitInfo EVar9;
  bool local_11d;
  WasmType WStack_ec;
  EmitInfo newInfo_1;
  EmitInfo info_1;
  ArgSlot iArg_1;
  int i_3;
  EmitInfo local_d0;
  EmitInfo newInfo;
  EmitInfo info;
  uint32 i_2;
  Local local_b4;
  WasmType local_b0;
  WasmType type;
  uint32 i_1;
  uint32 resultCount;
  EmitInfo local_a0;
  EmitInfo param;
  undefined1 local_90 [2];
  ArgSlot iArg;
  int i;
  PolymorphicEmitInfo inParams;
  ArgSlot paramCount;
  WasmSignature *signature;
  uint32 sigId;
  code *local_60;
  undefined8 local_58;
  TrackAllocData local_50;
  BlockInfo *local_28;
  BlockInfo *blockInfo;
  bool checkInParams_local;
  bool addBlockYieldInfo_local;
  WasmBytecodeGenerator *pWStack_18;
  ByteCodeLabel label_local;
  WasmBytecodeGenerator *this_local;
  WasmBlock blockData_local;
  
  blockInfo._2_1_ = checkInParams;
  blockInfo._3_1_ = addBlockYieldInfo;
  blockInfo._4_4_ = label;
  pWStack_18 = this;
  this_local = (WasmBytecodeGenerator *)blockData;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&BlockInfo::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
             ,0x771);
  alloc = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                    (&(this->m_alloc).
                      super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
                     &local_50);
  local_60 = Memory::ArenaAllocator::Alloc;
  local_58 = 0;
  this_00 = (BlockInfo *)new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)alloc,0x3f67b0);
  memset(this_00,0,0x28);
  BlockInfo::BlockInfo(this_00);
  this_00->label = blockInfo._4_4_;
  local_28 = this_00;
  if ((blockInfo._3_1_ & 1) != 0) {
    bVar2 = WasmBlock::IsSingleResult((WasmBlock *)&this_local);
    if (bVar2) {
      WVar4 = WasmBlock::GetSingleResult((WasmBlock *)&this_local);
      if (WVar4 != Void) {
        pPVar6 = &local_28->yieldInfo;
        WVar4 = WasmBlock::GetSingleResult((WasmBlock *)&this_local);
        pWVar7 = GetRegisterSpace(this,WVar4);
        RVar5 = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar7);
        signature._4_4_ = WasmBlock::GetSingleResult((WasmBlock *)&this_local);
        EmitInfo::EmitInfo((EmitInfo *)&sigId,RVar5,(WasmType *)((long)&signature + 4));
        PolymorphicEmitInfo::Init(pPVar6,_sigId);
      }
    }
    else {
      signature._0_4_ = WasmBlock::GetSignatureId((WasmBlock *)&this_local);
      this_01 = Js::WebAssemblyModule::GetSignature(this->m_module,(uint32)signature);
      inParams.field_1.singleInfo.type._2_2_ = WasmSignature::GetParamCount(this_01);
      local_11d = (blockInfo._2_1_ & 1) != 0 && inParams.field_1.singleInfo.type._2_2_ != 0;
      blockInfo._2_1_ = local_11d;
      PolymorphicEmitInfo::PolymorphicEmitInfo((PolymorphicEmitInfo *)local_90);
      if ((blockInfo._2_1_ & 1) != 0) {
        PolymorphicEmitInfo::Init
                  ((PolymorphicEmitInfo *)local_90,
                   (uint)(ushort)inParams.field_1.singleInfo.type._2_2_,&this->m_alloc);
        param.type = (WasmType)(ushort)inParams.field_1.singleInfo.type._2_2_;
        while (param.type = param.type - FirstLocalType, -1 < (int)param.type) {
          param.super_EmitInfoBase.location._2_2_ = (ArgSlot)param.type;
          expectedType = WasmSignature::GetParam(this_01,param.super_EmitInfoBase.location._2_2_);
          local_a0 = PopEvalStack(this,expectedType,(char16 *)0x0);
          ReleaseLocation(this,&local_a0);
          _i_1 = local_a0;
          PolymorphicEmitInfo::SetInfo
                    ((PolymorphicEmitInfo *)local_90,local_a0,
                     (uint)param.super_EmitInfoBase.location._2_2_);
        }
      }
      type = WasmSignature::GetResultCount(this_01);
      if (type != Void) {
        PolymorphicEmitInfo::Init(&local_28->yieldInfo,type,&this->m_alloc);
        for (local_b0 = Void; local_b0 < type; local_b0 = local_b0 + FirstLocalType) {
          local_b4 = WasmSignature::GetResult(this_01,local_b0);
          pPVar6 = &local_28->yieldInfo;
          pWVar7 = GetRegisterSpace(this,local_b4);
          RVar5 = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar7);
          EmitInfo::EmitInfo((EmitInfo *)&info.type,RVar5,&local_b4);
          PolymorphicEmitInfo::SetInfo(pPVar6,stack0xffffffffffffff44,local_b0);
        }
      }
      if ((blockInfo._2_1_ & 1) != 0) {
        PolymorphicEmitInfo::Init
                  (&local_28->paramInfo,(uint)(ushort)inParams.field_1.singleInfo.type._2_2_,
                   &this->m_alloc);
        for (info.super_EmitInfoBase.location = 0;
            info.super_EmitInfoBase.location < (ushort)inParams.field_1.singleInfo.type._2_2_;
            info.super_EmitInfoBase.location = info.super_EmitInfoBase.location + 1) {
          EVar8 = PolymorphicEmitInfo::GetInfo
                            ((PolymorphicEmitInfo *)local_90,info.super_EmitInfoBase.location);
          newInfo.type = EVar8.type;
          pWVar7 = GetRegisterSpace(this,newInfo.type);
          local_d0.super_EmitInfoBase.location = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar7);
          local_d0.type = newInfo.type;
          PolymorphicEmitInfo::SetInfo
                    (&local_28->paramInfo,local_d0,info.super_EmitInfoBase.location);
        }
        info_1.type = (WasmType)(ushort)inParams.field_1.singleInfo.type._2_2_;
        while (info_1.type = info_1.type - FirstLocalType, -1 < (int)info_1.type) {
          EVar8 = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)local_90,info_1.type & 0xffff)
          ;
          EVar9 = PolymorphicEmitInfo::GetInfo(&local_28->paramInfo,info_1.type & 0xffff);
          pIVar1 = this->m_writer;
          WStack_ec = EVar9.type;
          OVar3 = GetLoadOp(this,WStack_ec);
          (*pIVar1->_vptr_IWasmByteCodeWriter[0xf])
                    (pIVar1,(ulong)OVar3,(ulong)EVar9 & 0xffffffff,(ulong)EVar8 & 0xffffffff);
        }
      }
    }
  }
  JsUtil::Stack<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::Push
            (&this->m_blockInfos,&local_28);
  return local_28;
}

Assistant:

BlockInfo* WasmBytecodeGenerator::PushLabel(WasmBlock blockData, Js::ByteCodeLabel label, bool addBlockYieldInfo, bool checkInParams)
{
    BlockInfo* blockInfo = Anew(&m_alloc, BlockInfo);
    blockInfo->label = label;
    if (addBlockYieldInfo)
    {
        if (blockData.IsSingleResult())
        {
            if (blockData.GetSingleResult() != WasmTypes::Void)
            {
                blockInfo->yieldInfo.Init(EmitInfo(GetRegisterSpace(blockData.GetSingleResult())->AcquireTmpRegister(), blockData.GetSingleResult()));
            }
        }
        else
        {
            uint32 sigId = blockData.GetSignatureId();
            WasmSignature* signature = m_module->GetSignature(sigId);

            Js::ArgSlot paramCount = signature->GetParamCount();
            checkInParams = checkInParams && paramCount > 0;
            PolymorphicEmitInfo inParams;
            if (checkInParams)
            {
                inParams.Init(paramCount, &m_alloc);
                // Pop the params in reverse order
                for (int i = paramCount - 1; i >= 0; --i)
                {
                    Js::ArgSlot iArg = (Js::ArgSlot)i;
                    EmitInfo param = PopEvalStack(signature->GetParam(iArg));
                    ReleaseLocation(&param);
                    inParams.SetInfo(param, iArg);
                }
            }

            uint32 resultCount = signature->GetResultCount();
            if (resultCount > 0)
            {
                blockInfo->yieldInfo.Init(resultCount, &m_alloc);
                for (uint32 i = 0; i < resultCount; ++i)
                {
                    WasmTypes::WasmType type = signature->GetResult(i);
                    blockInfo->yieldInfo.SetInfo(EmitInfo(GetRegisterSpace(type)->AcquireTmpRegister(), type), i);
                }
            }

            if (checkInParams)
            {
                blockInfo->paramInfo.Init(paramCount, &m_alloc);
                // Acquire tmp registers in order
                for (uint32 i = 0; i < paramCount; ++i)
                {
                    EmitInfo info = inParams.GetInfo(i);
                    EmitInfo newInfo = info;
                    newInfo.location = GetRegisterSpace(info.type)->AcquireTmpRegister();
                    blockInfo->paramInfo.SetInfo(newInfo, i);
                }
                // Todo:: Instead of moving inparams to new location,
                // Treat inparams as local and bypass ReleaseLocation until we exit the scope

                // Move in params to new location in reverse order
                for (int i = paramCount - 1; i >= 0; --i)
                {
                    Js::ArgSlot iArg = (Js::ArgSlot)i;
                    EmitInfo info = inParams.GetInfo(iArg);
                    EmitInfo newInfo = blockInfo->paramInfo.GetInfo(iArg);
                    m_writer->AsmReg2(GetLoadOp(newInfo.type), newInfo.location, info.location);
                }
            }
        }
    }
    m_blockInfos.Push(blockInfo);
    return blockInfo;
}